

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDrainer.cpp
# Opt level: O3

size_t __thiscall
adios2::burstbuffer::FileDrainer::Write
          (FileDrainer *this,OutputFile *f,size_t count,char *buffer,string *path)

{
  undefined8 *puVar1;
  ulong uVar2;
  element_type *peVar3;
  bool bVar4;
  char cVar5;
  long *plVar6;
  undefined8 *puVar7;
  ulong *puVar8;
  size_t sVar9;
  size_type *psVar10;
  char cVar11;
  ulong uVar12;
  string __str;
  undefined8 *local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  ulong *local_110;
  uint local_108;
  undefined4 uStack_104;
  ulong local_100 [2];
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::ostream::write((char *)(f->
                              super___shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr,(long)buffer);
  peVar3 = (f->
           super___shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if (((byte)peVar3[*(long *)(*(long *)peVar3 + -0x18) + 0x20] & 1) == 0) {
    return count;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Toolkit","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"BurstBuffer::FileDrainer","")
  ;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Write","");
  std::operator+(&local_50,"FileDrainer couldn\'t write to file ",path);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar8 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar8) {
    local_e0 = *puVar8;
    lStack_d8 = plVar6[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar8;
    local_f0 = (ulong *)*plVar6;
  }
  local_e8 = plVar6[1];
  *plVar6 = (long)puVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  cVar11 = '\x01';
  if (9 < count) {
    sVar9 = count;
    cVar5 = '\x04';
    do {
      cVar11 = cVar5;
      if (sVar9 < 100) {
        cVar11 = cVar11 + -2;
        goto LAB_004a4df6;
      }
      if (sVar9 < 1000) {
        cVar11 = cVar11 + -1;
        goto LAB_004a4df6;
      }
      if (sVar9 < 10000) goto LAB_004a4df6;
      bVar4 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar5 = cVar11 + '\x04';
    } while (bVar4);
    cVar11 = cVar11 + '\x01';
  }
LAB_004a4df6:
  local_110 = local_100;
  std::__cxx11::string::_M_construct((ulong)&local_110,cVar11);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_110,local_108,count);
  uVar2 = CONCAT44(uStack_104,local_108) + local_e8;
  uVar12 = 0xf;
  if (local_f0 != &local_e0) {
    uVar12 = local_e0;
  }
  if (uVar12 < uVar2) {
    uVar12 = 0xf;
    if (local_110 != local_100) {
      uVar12 = local_100[0];
    }
    if (uVar2 <= uVar12) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_f0);
      goto LAB_004a4e78;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_110);
LAB_004a4e78:
  local_130 = &local_120;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar7[3];
  }
  else {
    local_120 = *puVar1;
    local_130 = (undefined8 *)*puVar7;
  }
  local_128 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_130);
  psVar10 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_b0.field_2._M_allocated_capacity = *psVar10;
    local_b0.field_2._8_8_ = plVar6[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar10;
    local_b0._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_b0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_70,&local_90,&local_d0,&local_b0,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_110 != local_100) {
    operator_delete(local_110);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return count;
}

Assistant:

size_t FileDrainer::Write(OutputFile &f, size_t count, const char *buffer, const std::string &path)
{
    f->write(buffer, static_cast<std::streamsize>(count));

    if (f->bad())
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "BurstBuffer::FileDrainer", "Write",
                                              "FileDrainer couldn't write to file " + path +
                                                  " count = " + std::to_string(count) + " bytes");
    }

    return count;
}